

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O2

bool __thiscall axl::io::ShmtBase::ensureMappingSize(ShmtBase *this,size_t size)

{
  File *this_00;
  int32_t *piVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  Module *pMVar5;
  uint64_t uVar6;
  undefined4 extraout_var;
  ulong size_00;
  ShmtFileHdr *pSVar7;
  
  bVar3 = true;
  if ((this->m_mapping).m_size < size) {
    pMVar5 = g::getModule();
    sVar2 = (pMVar5->m_systemInfo).m_pageSize;
    size_00 = -sVar2 & (size + sVar2) - 1;
    sys::atomicLock(&this->m_hdr->m_lock);
    this_00 = &this->m_file;
    uVar6 = psx::File::getSize(&this_00->m_file);
    if (uVar6 < size_00) {
      bVar3 = psx::File::setSize(&this_00->m_file,size_00);
      piVar1 = &this->m_hdr->m_lock;
      LOCK();
      if (*piVar1 == 1) {
        *piVar1 = 0;
      }
      UNLOCK();
      if (!bVar3) {
        return false;
      }
    }
    else {
      piVar1 = &this->m_hdr->m_lock;
      LOCK();
      if (*piVar1 == 1) {
        *piVar1 = 0;
      }
      UNLOCK();
    }
    bVar3 = false;
    iVar4 = Mapping::open(&this->m_mapping,(char *)this_00,0,size_00,0);
    pSVar7 = (ShmtFileHdr *)CONCAT44(extraout_var,iVar4);
    if (pSVar7 != (ShmtFileHdr *)0x0) {
      this->m_hdr = pSVar7;
      this->m_data = (char *)(pSVar7 + 1);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool
ShmtBase::ensureMappingSize(size_t size) {
	if (size <= m_mapping.getSize())
		return true;

	const g::SystemInfo* systemInfo = g::getModule()->getSystemInfo();
	size = sl::align(size, systemInfo->m_pageSize);

#if (_AXL_OS_POSIX)
	sys::atomicLock(&m_hdr->m_lock);
	if (size <= m_file.getSize()) {
		sys::atomicUnlock(&m_hdr->m_lock);
	} else {
		bool result = m_file.setSize(size);
		sys::atomicUnlock(&m_hdr->m_lock);
		if (!result)
			return false;
	}
#endif

	void* p = m_mapping.open(&m_file, 0, size);
	if (!p)
		return false;

	m_hdr = (ShmtFileHdr*)p;
	m_data = (char*)(m_hdr + 1);
	return true;
}